

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDLines.cpp
# Opt level: O3

void EDLines::LineFit(double *x,double *y,int count,double *a,double *b,double *e,int *invert)

{
  ulong uVar1;
  double *pdVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double dVar11;
  double dVar12;
  double dVar13;
  
  if (1 < count) {
    uVar1 = (ulong)(uint)count;
    dVar4 = 0.0;
    dVar5 = 0.0;
    uVar3 = 0;
    do {
      dVar4 = dVar4 + x[uVar3];
      dVar5 = dVar5 + y[uVar3];
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    dVar6 = (double)count;
    auVar9._8_8_ = dVar5;
    auVar9._0_8_ = dVar4;
    auVar10._8_8_ = dVar6;
    auVar10._0_8_ = dVar6;
    auVar10 = divpd(auVar9,auVar10);
    dVar7 = 0.0;
    dVar8 = 0.0;
    uVar3 = 0;
    do {
      dVar11 = x[uVar3] - auVar10._0_8_;
      dVar12 = y[uVar3] - auVar10._8_8_;
      dVar7 = dVar7 + dVar11 * dVar11;
      dVar8 = dVar8 + dVar12 * dVar12;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    pdVar2 = x;
    dVar11 = dVar5;
    dVar12 = dVar4;
    if (dVar7 < dVar8) {
      pdVar2 = y;
      dVar11 = dVar4;
      dVar12 = dVar5;
      y = x;
    }
    *invert = (uint)(dVar7 < dVar8);
    dVar7 = 0.0;
    dVar8 = 0.0;
    uVar3 = 0;
    do {
      dVar13 = pdVar2[uVar3];
      dVar7 = dVar7 + dVar13 * dVar13;
      dVar8 = dVar8 + y[uVar3] * dVar13;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    dVar13 = dVar6 * dVar7 - dVar12 * dVar12;
    *a = (dVar11 * dVar7 - dVar12 * dVar8) / dVar13;
    dVar13 = (dVar8 * dVar6 - dVar5 * dVar4) / dVar13;
    *b = dVar13;
    dVar4 = 0.0;
    if ((dVar13 != 0.0) || (NAN(dVar13))) {
      uVar3 = 0;
      do {
        dVar5 = (*a - (-(-1.0 / dVar13) * pdVar2[uVar3] + y[uVar3])) / (-1.0 / dVar13 - dVar13);
        dVar7 = pdVar2[uVar3] - dVar5;
        dVar5 = y[uVar3] - (dVar13 * dVar5 + *a);
        dVar4 = dVar4 + dVar7 * dVar7 + dVar5 * dVar5;
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      dVar4 = dVar4 / dVar6;
      if (dVar4 < 0.0) {
        dVar4 = sqrt(dVar4);
      }
      else {
        dVar4 = SQRT(dVar4);
      }
    }
    else {
      uVar3 = 0;
      do {
        dVar4 = dVar4 + ABS(*a - y[uVar3]);
        uVar3 = uVar3 + 1;
      } while (uVar1 != uVar3);
      dVar4 = dVar4 / dVar6;
    }
    *e = dVar4;
  }
  return;
}

Assistant:

void EDLines::LineFit(double * x, double * y, int count, double &a, double &b, double &e, int &invert)
{
	if (count<2) return;

	double S = count, Sx = 0.0, Sy = 0.0, Sxx = 0.0, Sxy = 0.0;
	for (int i = 0; i<count; i++) {
		Sx += x[i];
		Sy += y[i];
	} //end-for

	double mx = Sx / count;
	double my = Sy / count;

	double dx = 0.0;
	double dy = 0.0;
	for (int i = 0; i < count; i++) {
		dx += (x[i] - mx)*(x[i] - mx);
		dy += (y[i] - my)*(y[i] - my);
	} //end-for

	if (dx < dy) {
		// Vertical line. Swap x & y, Sx & Sy
		invert = 1;
		double *t = x;
		x = y;
		y = t;

		double d = Sx;
		Sx = Sy;
		Sy = d;

	}
	else {
		invert = 0;
	} //end-else  

	  // Now compute Sxx & Sxy
	for (int i = 0; i<count; i++) {
		Sxx += x[i] * x[i];
		Sxy += x[i] * y[i];
	} //end-for

	double D = S*Sxx - Sx*Sx;
	a = (Sxx*Sy - Sx*Sxy) / D;
	b = (S  *Sxy - Sx* Sy) / D;

	if (b == 0.0) {
		// Vertical or horizontal line
		double error = 0.0;
		for (int i = 0; i<count; i++) {
			error += fabs((a) - y[i]);
		} //end-for
		e = error / count;

	}
	else {
		double error = 0.0;
		for (int i = 0; i<count; i++) {
			// Let the line passing through (x[i], y[i]) that is perpendicular to a+bx be c+dx
			double d = -1.0 / (b);
			double c = y[i] - d*x[i];
			double x2 = ((a) - c) / (d - (b));
			double y2 = (a) + (b)*x2;

			double dist = (x[i] - x2)*(x[i] - x2) + (y[i] - y2)*(y[i] - y2);
			error += dist;
		} //end-for

		e = sqrt(error / count);
	} //end-else
}